

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O0

bool __thiscall
deqp::ShaderIntegerMixRenderCase::probe_pixel
          (ShaderIntegerMixRenderCase *this,TestLog *log,char *stage,int x,int y,IVec4 *expected)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_1c8;
  undefined1 local_48 [8];
  IVec4 pixel;
  IVec4 *expected_local;
  int y_local;
  int x_local;
  char *stage_local;
  TestLog *log_local;
  ShaderIntegerMixRenderCase *this_local;
  
  pixel.m_data._8_8_ = expected;
  expected_local._0_4_ = y;
  expected_local._4_4_ = x;
  _y_local = stage;
  stage_local = (char *)log;
  log_local = (TestLog *)this;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_48);
  glwReadPixels(expected_local._4_4_,(int)expected_local,1,1,0x8d99,0x1404,local_48);
  bVar1 = tcu::Vector<int,_4>::operator!=
                    ((Vector<int,_4> *)pixel.m_data._8_8_,(Vector<int,_4> *)local_48);
  if (bVar1) {
    tcu::TestLog::operator<<
              (&local_1c8,(TestLog *)stage_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1c8,(char **)&y_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [26])" shader failed at pixel (");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&expected_local + 4));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&expected_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [5])").  ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [5])0x2c0dbea);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(Vector<int,_4> *)local_48);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [12])0x2c16365);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(Vector<int,_4> *)pixel.m_data._8_8_);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c156ab);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool probe_pixel(TestLog& log, const char* stage, int x, int y, const tcu::IVec4& expected)
	{
		tcu::IVec4 pixel;

		glReadPixels(x, y, 1, 1, GL_RGBA_INTEGER, GL_INT, &pixel);

		if (expected != pixel)
		{
			log << TestLog::Message << stage << " shader failed at pixel (" << x << ", " << y << ").  "
				<< "Got " << pixel << ", expected " << expected << ")." << TestLog::EndMessage;
			return false;
		}

		return true;
	}